

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj.c
# Opt level: O1

int Maj_ManAddCnfStart(Maj_Man_t *p)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int (*paaiVar6) [3] [32];
  int (*paiVar7) [32];
  int *piVar8;
  int iVar9;
  int *piVar10;
  int (*paiVar11) [32];
  int *piVar12;
  int *piVar13;
  uint *plits;
  int pLits2 [2];
  int pLits [32];
  uint local_100;
  uint local_fc;
  long local_f8;
  int (*local_f0) [3] [32];
  int *local_e8;
  long local_e0;
  int (*local_d8) [32];
  int (*local_d0) [3] [32];
  int (*local_c8) [32];
  int (*local_c0) [3] [32];
  uint local_b8 [34];
  
  lVar4 = (long)p->nVars;
  if (p->nObjs <= p->nVars + 2) {
LAB_005a0304:
    if (3 < p->nObjs) {
      lVar4 = 2;
      lVar5 = 0x28;
      do {
        if (p->vOutLits->nSize <= lVar4) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                        ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        pVVar2 = p->vOutLits->pArray;
        iVar3 = *(int *)((long)pVVar2 + lVar5 + -4);
        if (iVar3 < 1) {
          __assert_fail("Vec_IntSize(vArray) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj.c"
                        ,0x134,"int Maj_ManAddCnfStart(Maj_Man_t *)");
        }
        iVar3 = bmcg_sat_solver_addclause(p->pSat,*(int **)((long)&pVVar2->nCap + lVar5),iVar3);
        if (iVar3 == 0) {
          return 0;
        }
        lVar4 = lVar4 + 1;
        lVar5 = lVar5 + 0x10;
      } while (lVar4 < (long)p->nObjs + -1);
    }
    return 1;
  }
  local_d0 = p->VarMarks;
  lVar5 = lVar4 + 2;
  paaiVar6 = p->VarMarks + lVar4 + 2;
  paiVar11 = p->VarMarks[lVar4 + 2] + 1;
LAB_005a008f:
  lVar4 = 0;
  local_e0 = lVar5;
  local_c8 = paiVar11;
  local_c0 = paaiVar6;
LAB_005a00a7:
  plits = local_b8;
  iVar3 = p->nObjs;
  if ((long)iVar3 < 1) {
    piVar10 = (int *)0x0;
  }
  else {
    lVar5 = 0;
    piVar10 = (int *)0x0;
    do {
      iVar1 = (*paaiVar6)[0][lVar5];
      if (iVar1 != 0) {
        if (iVar1 < 0) {
LAB_005a039e:
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        iVar9 = (int)piVar10;
        piVar10 = (int *)(ulong)(iVar9 + 1);
        local_b8[iVar9] = iVar1 * 2;
      }
      lVar5 = lVar5 + 1;
    } while (iVar3 != lVar5);
  }
  if ((int)piVar10 < 1) {
    __assert_fail("nLits > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj.c"
                  ,0x117,"int Maj_ManAddCnfStart(Maj_Man_t *)");
  }
  iVar3 = bmcg_sat_solver_addclause(p->pSat,(int *)plits,(int)piVar10);
  if (iVar3 == 0) {
    iVar3 = 1;
  }
  else {
    piVar12 = (int *)0x0;
    local_f8 = lVar4;
    local_f0 = paaiVar6;
    local_e8 = piVar10;
    local_d8 = paiVar11;
    do {
      piVar13 = (int *)((long)piVar12 + 1);
      if (piVar13 < local_e8) {
        piVar8 = (int *)0x1;
        do {
          if ((int)local_b8[(long)piVar12] < 0) {
LAB_005a037f:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x131,"int Abc_LitNot(int)");
          }
          local_100 = local_b8[(long)piVar12] ^ 1;
          if ((int)plits[(long)piVar8] < 0) goto LAB_005a037f;
          local_fc = plits[(long)piVar8] ^ 1;
          iVar3 = bmcg_sat_solver_addclause(p->pSat,(int *)&local_100,2);
          paiVar11 = local_d8;
          if (iVar3 == 0) goto LAB_005a029b;
          piVar8 = (int *)((long)piVar8 + 1);
        } while (piVar10 != piVar8);
      }
      paiVar11 = local_d8;
      plits = plits + 1;
      piVar10 = (int *)((long)piVar10 + -1);
      piVar12 = piVar13;
    } while (piVar13 != local_e8);
    iVar3 = 5;
    lVar4 = local_f8;
    paaiVar6 = local_f0;
    if ((local_f8 != 2) && (iVar3 = 0, 0 < p->nObjs)) {
      lVar4 = 0;
      paiVar7 = local_d8;
      do {
        if ((local_d0[local_e0][local_f8][lVar4] != 0) && (lVar4 < p->nObjs)) {
          local_e8 = local_d0[local_e0][local_f8] + lVar4;
          lVar5 = 0;
          do {
            iVar3 = (*paiVar7)[lVar5];
            if (iVar3 != 0) {
              if ((*local_e8 < 0) || (local_100 = *local_e8 * 2 + 1, iVar3 < 0)) goto LAB_005a039e;
              local_fc = iVar3 * 2 + 1;
              iVar3 = bmcg_sat_solver_addclause(p->pSat,(int *)&local_100,2);
              if (iVar3 == 0) goto LAB_005a029b;
            }
            lVar5 = lVar5 + 1;
          } while ((int)lVar5 + (int)lVar4 < p->nObjs);
        }
        lVar4 = lVar4 + 1;
        paiVar7 = (int (*) [32])(*paiVar7 + 1);
      } while (lVar4 < p->nObjs);
      iVar3 = 0;
      lVar4 = local_f8;
      paaiVar6 = local_f0;
    }
  }
  goto LAB_005a02ac;
LAB_005a029b:
  iVar3 = 1;
  lVar4 = local_f8;
  paaiVar6 = local_f0;
LAB_005a02ac:
  if (iVar3 != 0) {
    if (iVar3 != 5) {
      return 0;
    }
    goto LAB_005a02da;
  }
  lVar4 = lVar4 + 1;
  paaiVar6 = (int (*) [3] [32])(*paaiVar6 + 1);
  paiVar11 = paiVar11 + 1;
  if (lVar4 == 3) goto LAB_005a02da;
  goto LAB_005a00a7;
LAB_005a02da:
  lVar5 = local_e0 + 1;
  paaiVar6 = local_c0 + 1;
  paiVar11 = local_c8 + 3;
  if (p->nObjs <= lVar5) goto LAB_005a0304;
  goto LAB_005a008f;
}

Assistant:

int Maj_ManAddCnfStart( Maj_Man_t * p )
{
    int pLits[MAJ_NOBJS], pLits2[2], i, j, k, n, m;
    // input constraints
    for ( i = p->nVars + 2; i < p->nObjs; i++ )
    {
        for ( k = 0; k < 3; k++ )
        {
            int nLits = 0;
            for ( j = 0; j < p->nObjs; j++ )
                if ( p->VarMarks[i][k][j] )
                    pLits[nLits++] = Abc_Var2Lit( p->VarMarks[i][k][j], 0 );
            assert( nLits > 0 );
            // input uniqueness
            if ( !bmcg_sat_solver_addclause( p->pSat, pLits, nLits ) )
                return 0;
            for ( n = 0;   n < nLits; n++ )
            for ( m = n+1; m < nLits; m++ )
            {
                pLits2[0] = Abc_LitNot(pLits[n]);
                pLits2[1] = Abc_LitNot(pLits[m]);
                if ( !bmcg_sat_solver_addclause( p->pSat, pLits2, 2 ) )
                    return 0;
            }
            if ( k == 2 )
                break;
            // symmetry breaking
            for ( j = 0; j < p->nObjs; j++ ) if ( p->VarMarks[i][k][j] )
            for ( n = j; n < p->nObjs; n++ ) if ( p->VarMarks[i][k+1][n] )
            {
                pLits2[0] = Abc_Var2Lit( p->VarMarks[i][k][j], 1 );
                pLits2[1] = Abc_Var2Lit( p->VarMarks[i][k+1][n], 1 );
                if ( !bmcg_sat_solver_addclause( p->pSat, pLits2, 2 ) )
                    return 0;
            }
        }
    }
    // outputs should be used
    for ( i = 2; i < p->nObjs - 1; i++ )
    {
        Vec_Int_t * vArray = Vec_WecEntry(p->vOutLits, i);
        assert( Vec_IntSize(vArray) > 0 );
        if ( !bmcg_sat_solver_addclause( p->pSat, Vec_IntArray(vArray), Vec_IntSize(vArray) ) )
            return 0;
    }
    return 1;
}